

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.h
# Opt level: O3

void slang::DiagnosticEngine::setDefaultFormatter<slang::ast::Type_const*>
               (shared_ptr<slang::DiagArgFormatter> *formatter)

{
  long lVar1;
  char *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint uVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong pos0;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong hash;
  ulong uVar17;
  pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *ppVar18;
  undefined1 auVar19 [16];
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  byte bVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  byte bVar35;
  locator res;
  try_emplace_args_t local_b1;
  type_index local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  __shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2> *local_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_b0._M_target = (type_info *)&ast::Type_const*::typeinfo;
  local_70 = &formatter->super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>;
  sVar12 = std::type_info::hash_code((type_info *)&ast::Type_const*::typeinfo);
  lVar9 = DAT_006ea800;
  lVar8 = DAT_006ea7f8;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar12;
  hash = SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar13 = hash >> (defaultFormatters & 0x3f);
  lVar1 = (hash & 0xff) * 4;
  cVar20 = (&UNK_0051239c)[lVar1];
  cVar21 = (&UNK_0051239d)[lVar1];
  cVar22 = (&UNK_0051239e)[lVar1];
  bVar23 = (&UNK_0051239f)[lVar1];
  uVar17 = (ulong)((uint)hash & 7);
  uVar16 = 0;
  pos0 = uVar13;
  uVar14 = DAT_006ea7f0;
  cVar24 = cVar20;
  cVar25 = cVar21;
  cVar26 = cVar22;
  bVar27 = bVar23;
  cVar28 = cVar20;
  cVar29 = cVar21;
  cVar30 = cVar22;
  bVar31 = bVar23;
  cVar32 = cVar20;
  cVar33 = cVar21;
  cVar34 = cVar22;
  bVar35 = bVar23;
  do {
    pcVar2 = (char *)(lVar8 + uVar13 * 0x10);
    local_58 = *pcVar2;
    cStack_57 = pcVar2[1];
    cStack_56 = pcVar2[2];
    bStack_55 = pcVar2[3];
    cStack_54 = pcVar2[4];
    cStack_53 = pcVar2[5];
    cStack_52 = pcVar2[6];
    bStack_51 = pcVar2[7];
    cStack_50 = pcVar2[8];
    cStack_4f = pcVar2[9];
    cStack_4e = pcVar2[10];
    bStack_4d = pcVar2[0xb];
    cStack_4c = pcVar2[0xc];
    cStack_4b = pcVar2[0xd];
    cStack_4a = pcVar2[0xe];
    bVar5 = pcVar2[0xf];
    auVar19[0] = -(local_58 == cVar20);
    auVar19[1] = -(cStack_57 == cVar21);
    auVar19[2] = -(cStack_56 == cVar22);
    auVar19[3] = -(bStack_55 == bVar23);
    auVar19[4] = -(cStack_54 == cVar24);
    auVar19[5] = -(cStack_53 == cVar25);
    auVar19[6] = -(cStack_52 == cVar26);
    auVar19[7] = -(bStack_51 == bVar27);
    auVar19[8] = -(cStack_50 == cVar28);
    auVar19[9] = -(cStack_4f == cVar29);
    auVar19[10] = -(cStack_4e == cVar30);
    auVar19[0xb] = -(bStack_4d == bVar31);
    auVar19[0xc] = -(cStack_4c == cVar32);
    auVar19[0xd] = -(cStack_4b == cVar33);
    auVar19[0xe] = -(cStack_4a == cVar34);
    auVar19[0xf] = -(bVar5 == bVar35);
    uVar11 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
    uVar15 = uVar16;
    bStack_49 = bVar5;
    if (uVar11 != 0) {
      local_78 = lVar9 + uVar13 * 0x168;
      do {
        uVar3 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        ppVar18 = (pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_> *)
                  (local_78 + (ulong)uVar3 * 0x18);
        pcVar2 = *(char **)((ppVar18->first)._M_target + 8);
        if (pcVar2 == "PKN5slang3ast4TypeE") goto LAB_003e9fe6;
        local_a8 = uVar17;
        local_a0 = uVar13;
        local_98 = hash;
        local_90 = uVar16;
        local_88 = uVar14;
        local_80 = pos0;
        local_68 = cVar20;
        cStack_67 = cVar21;
        cStack_66 = cVar22;
        bStack_65 = bVar23;
        cStack_64 = cVar24;
        cStack_63 = cVar25;
        cStack_62 = cVar26;
        bStack_61 = bVar27;
        cStack_60 = cVar28;
        cStack_5f = cVar29;
        cStack_5e = cVar30;
        bStack_5d = bVar31;
        cStack_5c = cVar32;
        cStack_5b = cVar33;
        cStack_5a = cVar34;
        bStack_59 = bVar35;
        iVar10 = strcmp("PKN5slang3ast4TypeE",pcVar2);
        if (iVar10 == 0) goto LAB_003e9fe6;
        uVar11 = uVar11 - 1 & uVar11;
        uVar13 = local_a0;
        pos0 = local_80;
        uVar14 = local_88;
        uVar15 = local_90;
        uVar16 = local_90;
        hash = local_98;
        uVar17 = local_a8;
        cVar20 = local_68;
        cVar21 = cStack_67;
        cVar22 = cStack_66;
        bVar23 = bStack_65;
        cVar24 = cStack_64;
        cVar25 = cStack_63;
        cVar26 = cStack_62;
        bVar27 = bStack_61;
        cVar28 = cStack_60;
        cVar29 = cStack_5f;
        cVar30 = cStack_5e;
        bVar31 = bStack_5d;
        cVar32 = cStack_5c;
        cVar33 = cStack_5b;
        cVar34 = cStack_5a;
        bVar35 = bStack_59;
      } while (uVar11 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar17] & bVar5) == 0) break;
    uVar16 = uVar15 + 1;
    uVar13 = uVar13 + uVar15 + 1 & uVar14;
  } while (uVar16 <= uVar14);
  if (DAT_006ea810 < DAT_006ea808) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
    ::nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
                *)&defaultFormatters,(arrays_type *)&defaultFormatters,pos0,hash,&local_b1,&local_b0
              );
    DAT_006ea810 = DAT_006ea810 + 1;
    ppVar18 = local_48.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::shared_ptr<slang::DiagArgFormatter>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::shared_ptr<slang::DiagArgFormatter>>>>
                *)&defaultFormatters,hash,&local_b1,&local_b0);
    ppVar18 = local_48.p;
  }
LAB_003e9fe6:
  peVar6 = local_70->_M_ptr;
  p_Var7 = (local_70->_M_refcount)._M_pi;
  local_70->_M_ptr = (element_type *)0x0;
  local_70->_M_refcount = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (ppVar18->second).super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  (ppVar18->second).super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar6;
  (ppVar18->second).super___shared_ptr<slang::DiagArgFormatter,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var7;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return;
}

Assistant:

static void setDefaultFormatter(std::shared_ptr<DiagArgFormatter> formatter) {
        defaultFormatters[SLANG_TYPEOF(ForType)] = std::move(formatter);
    }